

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O3

cstr idx2::ToRawFileName(metadata *Meta)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  dtype dVar4;
  long lVar5;
  char *pcVar6;
  long *in_FS_OFFSET;
  printer Pr;
  printer local_30;
  
  pcVar6 = (char *)(*in_FS_OFFSET + -0x180);
  printer::printer(&local_30,pcVar6,0x180);
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar6 = "false && \"buffer too small\"";
LAB_0019be0d:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x16,"cstr idx2::ToRawFileName(const metadata &)");
    }
    iVar3 = snprintf(local_30.Buf,(long)local_30.Size,"%s-",Meta);
    local_30.Buf = local_30.Buf + iVar3;
    iVar2 = local_30.Size - iVar3;
    bVar1 = local_30.Size < iVar3;
    local_30.Size = iVar2;
    if (iVar2 == 0 || bVar1) {
      pcVar6 = "false && \"buffer overflow?\"";
      goto LAB_0019be0d;
    }
  }
  else {
    if ((local_30.Buf != (char *)0x0) || ((FILE *)local_30.File == (FILE *)0x0)) {
      pcVar6 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_0019be0d;
    }
    fprintf((FILE *)local_30.File,"%s-",Meta);
  }
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar6 = "false && \"buffer too small\"";
LAB_0019be3e:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x17,"cstr idx2::ToRawFileName(const metadata &)");
    }
    iVar2 = snprintf(local_30.Buf,(long)local_30.Size,"%s-",Meta->Field);
    local_30.Buf = local_30.Buf + iVar2;
    iVar3 = local_30.Size - iVar2;
    if (local_30.Size - iVar2 == 0 || local_30.Size < iVar2) {
      pcVar6 = "false && \"buffer overflow?\"";
      goto LAB_0019be3e;
    }
  }
  else {
    if ((local_30.Buf != (char *)0x0) || ((FILE *)local_30.File == (FILE *)0x0)) {
      pcVar6 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_0019be3e;
    }
    fprintf((FILE *)local_30.File,"%s-",Meta->Field);
    iVar3 = local_30.Size;
  }
  local_30.Size = iVar3;
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar6 = "false && \"buffer too small\"";
    }
    else {
      iVar2 = snprintf(local_30.Buf,(long)local_30.Size,"[%d-%d-%d]-",
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
      local_30.Buf = local_30.Buf + iVar2;
      iVar3 = local_30.Size - iVar2;
      if (local_30.Size - iVar2 != 0 && iVar2 <= local_30.Size) goto LAB_0019bd0d;
      pcVar6 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((local_30.Buf == (char *)0x0) && ((FILE *)local_30.File != (FILE *)0x0)) {
      fprintf((FILE *)local_30.File,"[%d-%d-%d]-",(ulong)(uint)(Meta->Dims3).field_0.field_0.X,
              (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
              (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
      iVar3 = local_30.Size;
LAB_0019bd0d:
      local_30.Size = iVar3;
      dVar4 = Meta->DType;
      lVar5 = 0x10;
      do {
        if (*(dtype *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar5) == dVar4)
        goto LAB_0019bd34;
        lVar5 = lVar5 + 0x18;
      } while (lVar5 != 0x100);
      dVar4 = __Invalid__;
LAB_0019bd34:
      lVar5 = 0x10;
      while (*(dtype *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar5) != dVar4) {
        lVar5 = lVar5 + 0x18;
        if (lVar5 == 0x100) {
          __assert_fail("It != End(EnumS.NameMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataTypes.h"
                        ,10,"stref idx2::ToString(dtype)");
        }
      }
      if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
        if ((long)local_30.Size < 2) {
          pcVar6 = "false && \"buffer too small\"";
        }
        else {
          iVar3 = snprintf(local_30.Buf,(long)local_30.Size,"%.*s");
          local_30.Buf = local_30.Buf + iVar3;
          if (iVar3 < local_30.Size) {
            return pcVar6;
          }
          pcVar6 = "false && \"buffer overflow?\"";
        }
      }
      else {
        if ((local_30.Buf == (char *)0x0) && ((FILE *)local_30.File != (FILE *)0x0)) {
          fprintf((FILE *)local_30.File,"%.*s",(ulong)*(uint *)(&bitstream::Masks + lVar5),
                  *(undefined8 *)(&bitstream::Masks.Len + lVar5));
          return pcVar6;
        }
        pcVar6 = "false && \"unavailable or ambiguous printer destination\"";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x1a,"cstr idx2::ToRawFileName(const metadata &)");
    }
    pcVar6 = "false && \"unavailable or ambiguous printer destination\"";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                ,0x18,"cstr idx2::ToRawFileName(const metadata &)");
}

Assistant:

cstr
ToRawFileName(const metadata& Meta)
{
  printer Pr(Meta.String, sizeof(Meta.String));
  idx2_Print(&Pr, "%s-", Meta.Name);
  idx2_Print(&Pr, "%s-", Meta.Field);
  idx2_Print(&Pr, "[%d-%d-%d]-", Meta.Dims3.X, Meta.Dims3.Y, Meta.Dims3.Z);
  stref TypeStr = ToString(Meta.DType);
  idx2_Print(&Pr, "%.*s", TypeStr.Size, TypeStr.Ptr);

  return Meta.String;
}